

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O3

vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
* LDPC4QKD::RateAdaptiveCode<unsigned_short>::compute_mother_pos_varn<unsigned_int>
            (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *__return_storage_ptr__,vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
            vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx)

{
  vector<unsigned_short,std::allocator<unsigned_short>> *this;
  ushort uVar1;
  ushort *puVar2;
  pointer puVar3;
  iterator __position;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __result;
  ushort *puVar4;
  pointer puVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  long lVar12;
  bool bVar13;
  allocator_type local_49;
  value_type local_48;
  
  puVar5 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar4 + 1;
  if (puVar8 != puVar2 && puVar4 != puVar2) {
    uVar11 = *puVar4;
    do {
      uVar1 = *puVar8;
      bVar13 = uVar11 < uVar1;
      if (uVar11 <= uVar1) {
        uVar11 = uVar1;
      }
      if (bVar13) {
        puVar4 = puVar8;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
  }
  puVar3 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)*puVar4 + 1,&local_48,&local_49);
  lVar12 = (long)puVar5 - (long)puVar3 >> 2;
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffff0000);
  if (lVar12 != 1) {
    puVar5 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar9 = 0;
    do {
      uVar6 = (uint)uVar7;
      uVar10 = (ulong)puVar5[uVar9];
      if (puVar5[uVar9] < puVar5[(uVar7 & 0xffff) + 1]) {
        do {
          this = (vector<unsigned_short,std::allocator<unsigned_short>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start +
                 (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar10]);
          __position._M_current = *(unsigned_short **)(this + 8);
          if (__position._M_current == *(unsigned_short **)(this + 0x10)) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>(this,__position,(unsigned_short *)&local_48);
            puVar5 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *__position._M_current = (unsigned_short)uVar7;
            *(unsigned_short **)(this + 8) = __position._M_current + 1;
          }
          uVar10 = uVar10 + 1;
          uVar7 = (ulong)local_48.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start & 0xffff;
          uVar6 = (uint)(ushort)local_48.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < puVar5[uVar7 + 1]);
      }
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)uVar6;
      local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT62(local_48.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start._2_6_,(short)uVar6);
      uVar9 = (ulong)(uVar6 & 0xffff);
    } while (uVar9 < lVar12 - 1U);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<idx_t>> compute_mother_pos_varn(
                const std::vector<colptr_t> &colptr,
                const std::vector<idx_t> &rowIdx) {
            // number of columns in full matrix represented by given compressed sparse column (CSC) storage
            const auto nCols = colptr.size() - 1;
            // number of rows in full matrix represented by given compressed sparse column (CSC) storage
            const auto nMotherRows = *std::max_element(rowIdx.begin(), rowIdx.end()) + 1u;

            std::vector<std::vector<idx_t>> pos_varn_tmp{nMotherRows, std::vector<idx_t>{}};
            for (idx_t col = 0; col < nCols; col++) {
                for (auto j = colptr[col]; j < colptr[col + 1u]; j++) {
                    pos_varn_tmp[rowIdx[j]].push_back(col);
                }
            }
            return pos_varn_tmp;
        }